

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O1

char * base64_decode_fails_with_invalid_lengths(void)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = hdr_base64_decode((char *)0x0,5,(uint8_t *)0x0,3);
  if (iVar1 == 0) {
    pcVar2 = "Input length % 4 != 0";
  }
  else {
    iVar1 = hdr_base64_decode((char *)0x0,3,(uint8_t *)0x0,3);
    if (iVar1 == 0) {
      pcVar2 = "Input length < 4";
    }
    else {
      iVar1 = hdr_base64_decode((char *)0x0,8,(uint8_t *)0x0,7);
      pcVar2 = "Output length not 3/4 of input length";
      if (iVar1 != 0) {
        pcVar2 = (char *)0x0;
      }
    }
  }
  return pcVar2;
}

Assistant:

static char* base64_decode_fails_with_invalid_lengths(void)
{
    mu_assert("Input length % 4 != 0", hdr_base64_decode(NULL, 5, NULL, 3) != 0);
    mu_assert("Input length < 4", hdr_base64_decode(NULL, 3, NULL, 3) != 0);
    mu_assert(
        "Output length not 3/4 of input length",
        hdr_base64_decode(NULL, 8, NULL, 7) != 0);

    return 0;
}